

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmParseTree.cpp
# Opt level: O0

WasmType Wasm::LanguageTypes::ToWasmType(int8 binType)

{
  WasmCompilationException *this;
  WasmType local_c;
  int8 binType_local;
  
  switch(binType) {
  case -0xffffff05:
    Simd::EnsureSimdIsEnabled();
    local_c = V128;
    break;
  case -0xffffff04:
    local_c = F64;
    break;
  case -0xffffff03:
    local_c = F32;
    break;
  case -0xffffff02:
    local_c = I64;
    break;
  case -0xffffff01:
    local_c = FirstLocalType;
    break;
  default:
    this = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this,L"Invalid binary type %d",(ulong)(uint)(int)binType);
    __cxa_throw(this,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  return local_c;
}

Assistant:

WasmTypes::WasmType LanguageTypes::ToWasmType(int8 binType)
{
    switch (binType)
    {
    case LanguageTypes::i32: return WasmTypes::I32;
    case LanguageTypes::i64: return WasmTypes::I64;
    case LanguageTypes::f32: return WasmTypes::F32;
    case LanguageTypes::f64: return WasmTypes::F64;
#ifdef ENABLE_WASM_SIMD
    case LanguageTypes::v128:
        Simd::EnsureSimdIsEnabled();
        return WasmTypes::V128;
#endif
    default:
        throw WasmCompilationException(_u("Invalid binary type %d"), binType);
    }
}